

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::setPrimalBounds(SPxSolverBase<double> *this)

{
  VectorBase<double> *this_00;
  VectorBase<double> *this_01;
  double local_28;
  
  VectorBase<double>::operator=
            (&this->theUCbound,&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.up);
  VectorBase<double>::operator=
            (&this->theLCbound,&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.low);
  this_00 = &this->theURbound;
  this_01 = &this->theLRbound;
  if (this->theRep != ROW) {
    VectorBase<double>::operator=
              (this_00,&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left);
    VectorBase<double>::operator=
              (this_01,&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right);
    local_28 = -1.0;
    VectorBase<double>::operator*=(this_00,&local_28);
    local_28 = -1.0;
    VectorBase<double>::operator*=(this_01,&local_28);
    return;
  }
  VectorBase<double>::operator=
            (this_00,&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right);
  VectorBase<double>::operator=
            (this_01,&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left);
  return;
}

Assistant:

void SPxSolverBase<R>::setPrimalBounds()
{

   theUCbound = SPxLPBase<R>::upper();
   theLCbound = SPxLPBase<R>::lower();

   if(rep() == ROW)
   {
      theURbound = this->rhs();
      theLRbound = this->lhs();
   }
   else
   {
      theURbound = this->lhs();
      theLRbound = this->rhs();
      theURbound *= -1.0;
      theLRbound *= -1.0;
   }
}